

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O0

int Lpk_ResynthesizeNodeNew(Lpk_Man_t *p)

{
  Vec_Ptr_t *p_00;
  uint DelayLim;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  abctime aVar6;
  Lpk_Cut_t *pCut_00;
  Abc_Obj_t *pAVar7;
  uint *pTruth_00;
  int nGain;
  int nSuppSize;
  int Required;
  abctime clk;
  uint local_48;
  int k;
  int i;
  int nCutNodes;
  int nNodesAft;
  int nNodesBef;
  uint *pTruth;
  Lpk_Cut_t *pCut;
  Abc_Obj_t *pLeaf;
  Abc_Obj_t *pObjNew;
  Lpk_Man_t *p_local;
  
  DelayLim = Abc_ObjRequiredLevel(p->pObj);
  aVar5 = Abc_Clock();
  iVar1 = Lpk_NodeCuts(p);
  if (iVar1 == 0) {
    aVar6 = Abc_Clock();
    p->timeCuts = (aVar6 - aVar5) + p->timeCuts;
    return 0;
  }
  aVar6 = Abc_Clock();
  p->timeCuts = (aVar6 - aVar5) + p->timeCuts;
  if (p->pPars->fVeryVerbose != 0) {
    printf("Node %5d : Mffc size = %5d. Cuts = %5d.  Level = %2d. Req = %2d.\n",
           (ulong)(uint)p->pObj->Id,(ulong)(uint)p->nMffc,(ulong)(uint)p->nEvals,
           (ulong)(*(uint *)&p->pObj->field_0x14 >> 0xc),(ulong)DelayLim);
  }
  p->nCutsTotal = p->nCuts + p->nCutsTotal;
  p->nCutsUseful = p->nEvals + p->nCutsUseful;
  local_48 = 0;
  do {
    if (p->nEvals <= (int)local_48) {
      return 1;
    }
    pCut_00 = p->pCuts + p->pEvals[(int)local_48];
    if ((p->pPars->fFirst != 0) && (local_48 == 1)) {
      return 1;
    }
    for (clk._4_4_ = 0; clk._4_4_ < (int)(*(uint *)pCut_00 & 0x3f); clk._4_4_ = clk._4_4_ + 1) {
      pAVar7 = Abc_NtkObj(p->pNtk,pCut_00->pLeaves[clk._4_4_]);
      (pAVar7->vFanouts).nSize = (pAVar7->vFanouts).nSize + 1;
    }
    iVar1 = Abc_NodeMffcLabel(p->pObj);
    for (clk._4_4_ = 0; clk._4_4_ < (int)(*(uint *)pCut_00 & 0x3f); clk._4_4_ = clk._4_4_ + 1) {
      pAVar7 = Abc_NtkObj(p->pNtk,pCut_00->pLeaves[clk._4_4_]);
      (pAVar7->vFanouts).nSize = (pAVar7->vFanouts).nSize + -1;
    }
    if (iVar1 == (*(uint *)pCut_00 >> 6 & 0x3f) - (*(uint *)pCut_00 >> 0xc & 0x3f)) {
      Vec_PtrClear(p->vLeaves);
      for (clk._4_4_ = 0; clk._4_4_ < (int)(*(uint *)pCut_00 & 0x3f); clk._4_4_ = clk._4_4_ + 1) {
        p_00 = p->vLeaves;
        pAVar7 = Abc_NtkObj(p->pNtk,pCut_00->pLeaves[clk._4_4_]);
        Vec_PtrPush(p_00,pAVar7);
      }
      aVar5 = Abc_Clock();
      pTruth_00 = Lpk_CutTruth(p,pCut_00,0);
      aVar6 = Abc_Clock();
      p->timeTruth = (aVar6 - aVar5) + p->timeTruth;
      aVar5 = Abc_Clock();
      Lpk_ComputeSupports(p,pCut_00,pTruth_00);
      aVar6 = Abc_Clock();
      p->timeSupps = (aVar6 - aVar5) + p->timeSupps;
      if (p->pPars->fVeryVerbose != 0) {
        uVar2 = Extra_TruthSupportSize(pTruth_00,*(uint *)pCut_00 & 0x3f);
        printf("  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ",(double)pCut_00->Weight,
               (ulong)local_48,(ulong)(*(uint *)pCut_00 & 0x3f),(ulong)uVar2,
               (ulong)(*(uint *)pCut_00 >> 6 & 0x3f),(ulong)(*(uint *)pCut_00 >> 0xc & 0x3f),
               *(uint *)pCut_00 >> 0x12 & 0x3f);
        for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->vLeaves), clk._4_4_ < iVar1;
            clk._4_4_ = clk._4_4_ + 1) {
          pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,clk._4_4_);
          uVar2 = Abc_ObjLevel(pAVar7);
          printf("%c=%d ",(ulong)(clk._4_4_ + 0x61),(ulong)uVar2);
        }
        printf("\n");
        Kit_DsdPrintFromTruth(pTruth_00,*(uint *)pCut_00 & 0x3f);
      }
      iVar1 = Abc_NtkNodeNum(p->pNtk);
      aVar5 = Abc_Clock();
      pAVar7 = Lpk_Decompose(p,p->pNtk,p->vLeaves,pTruth_00,p->puSupps,p->pPars->nLutSize,
                             ((*(uint *)pCut_00 >> 6 & 0x3f) - (*(uint *)pCut_00 >> 0xc & 0x3f)) +
                             -1 + (uint)(0 < p->pPars->fZeroCost),DelayLim);
      aVar6 = Abc_Clock();
      p->timeEval = (aVar6 - aVar5) + p->timeEval;
      iVar3 = Abc_NtkNodeNum(p->pNtk);
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        uVar2 = ((*(uint *)pCut_00 >> 6 & 0x3f) - (*(uint *)pCut_00 >> 0xc & 0x3f)) -
                (iVar3 - iVar1);
        if ((int)uVar2 < 1 - p->pPars->fZeroCost) {
          __assert_fail("nGain >= 1 - p->pPars->fZeroCost",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                        ,0x1d6,"int Lpk_ResynthesizeNodeNew(Lpk_Man_t *)");
        }
        iVar1 = Abc_ObjLevel(pAVar7);
        if (iVar1 <= (int)DelayLim) {
          p->nGainTotal = uVar2 + p->nGainTotal;
          p->nChanges = p->nChanges + 1;
          if (p->pPars->fVeryVerbose != 0) {
            uVar4 = Abc_ObjLevel(pAVar7);
            printf("Performed resynthesis: Gain = %2d. Level = %2d. Req = %2d.\n",(ulong)uVar2,
                   (ulong)uVar4,(ulong)DelayLim);
          }
          Abc_NtkUpdate(p->pObj,pAVar7,p->vLevels);
          return 1;
        }
        __assert_fail("Abc_ObjLevel(pObjNew) <= Required",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                      ,0x1d7,"int Lpk_ResynthesizeNodeNew(Lpk_Man_t *)");
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

int Lpk_ResynthesizeNodeNew( Lpk_Man_t * p )
{
//    static int Count = 0;
    Abc_Obj_t * pObjNew, * pLeaf;
    Lpk_Cut_t * pCut;
    unsigned * pTruth;
    int nNodesBef, nNodesAft, nCutNodes;
    int i, k;
    abctime clk;
    int Required = Abc_ObjRequiredLevel(p->pObj);
//    CloudNode * pFun2;//, * pFun1;

    // compute the cuts
clk = Abc_Clock();
    if ( !Lpk_NodeCuts( p ) )
    {
p->timeCuts += Abc_Clock() - clk;
        return 0;
    }
p->timeCuts += Abc_Clock() - clk;

    if ( p->pPars->fVeryVerbose )
        printf( "Node %5d : Mffc size = %5d. Cuts = %5d.  Level = %2d. Req = %2d.\n", 
            p->pObj->Id, p->nMffc, p->nEvals, p->pObj->Level, Required );
    // try the good cuts
    p->nCutsTotal  += p->nCuts;
    p->nCutsUseful += p->nEvals;
    for ( i = 0; i < p->nEvals; i++ )
    {
        // get the cut
        pCut = p->pCuts + p->pEvals[i];
        if ( p->pPars->fFirst && i == 1 )
            break;
//        if ( pCut->Weight < 1.05 )
//            continue;

        // skip bad cuts        
//        printf( "Mffc size = %d.  ", Abc_NodeMffcLabel(p->pObj) );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize++;
        nCutNodes = Abc_NodeMffcLabel(p->pObj);
//        printf( "Mffc with cut = %d.  ", nCutNodes );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize--;
//        printf( "Mffc cut = %d.  ", (int)pCut->nNodes - (int)pCut->nNodesDup );
//        printf( "\n" );
        if ( nCutNodes != (int)pCut->nNodes - (int)pCut->nNodesDup )
            continue;

        // collect nodes into the array
        Vec_PtrClear( p->vLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_PtrPush( p->vLeaves, Abc_NtkObj(p->pNtk, pCut->pLeaves[k]) );

        // compute the truth table
clk = Abc_Clock();
        pTruth = Lpk_CutTruth( p, pCut, 0 );
p->timeTruth += Abc_Clock() - clk;
clk = Abc_Clock();
        Lpk_ComputeSupports( p, pCut, pTruth );        
p->timeSupps += Abc_Clock() - clk;
//clk = Abc_Clock();
//        pFun1 = Lpk_CutTruthBdd( p, pCut );
//p->timeTruth2 += Abc_Clock() - clk;
/*
clk = Abc_Clock();
        Cloud_Restart( p->pDsdMan->dd );
        pFun2 = Kit_TruthToCloud( p->pDsdMan->dd, pTruth, pCut->nLeaves );
        RetValue = Kit_CreateCloud( p->pDsdMan->dd, pFun2, p->vBddNodes );
p->timeTruth3 += Abc_Clock() - clk;
*/
//        if ( pFun1 != pFun2 )
//            printf( "Truth tables do not agree!\n" );
//        else
//            printf( "Fine!\n" );

        if ( p->pPars->fVeryVerbose )
        {
//            char * pFileName;
            int nSuppSize = Extra_TruthSupportSize( pTruth, pCut->nLeaves );
            printf( "  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ", 
                i, pCut->nLeaves, nSuppSize, pCut->nNodes, pCut->nNodesDup, pCut->nLuts, pCut->Weight );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pLeaf, k )
                printf( "%c=%d ", 'a'+k, Abc_ObjLevel(pLeaf) );
            printf( "\n" );
            Kit_DsdPrintFromTruth( pTruth, pCut->nLeaves );
//            pFileName = Kit_TruthDumpToFile( pTruth, pCut->nLeaves, Count++ );
//            printf( "Saved truth table in file \"%s\".\n", pFileName );
        }

        // update the network
        nNodesBef = Abc_NtkNodeNum(p->pNtk);
clk = Abc_Clock();
        pObjNew = Lpk_Decompose( p, p->pNtk, p->vLeaves, pTruth, p->puSupps, p->pPars->nLutSize,
            (int)pCut->nNodes - (int)pCut->nNodesDup - 1 + (int)(p->pPars->fZeroCost > 0), Required );
p->timeEval += Abc_Clock() - clk;
        nNodesAft = Abc_NtkNodeNum(p->pNtk);

        // perform replacement
        if ( pObjNew )
        {
            int nGain = (int)pCut->nNodes - (int)pCut->nNodesDup - (nNodesAft - nNodesBef);
            assert( nGain >= 1 - p->pPars->fZeroCost );
            assert( Abc_ObjLevel(pObjNew) <= Required );
/*
            if ( nGain <= 0 )
            {
                int x = 0;
            }
            if ( Abc_ObjLevel(pObjNew) > Required )
            {
                int x = 0;
            }
*/
            p->nGainTotal += nGain;
            p->nChanges++;
            if ( p->pPars->fVeryVerbose )
                printf( "Performed resynthesis: Gain = %2d. Level = %2d. Req = %2d.\n", nGain, Abc_ObjLevel(pObjNew), Required );
            Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
//printf( "%3d : %d-%d=%d(%d) \n", p->nChanges, nNodesBef, Abc_NtkNodeNum(p->pNtk), nNodesBef-Abc_NtkNodeNum(p->pNtk), nGain );
            break;
        }
    }
    return 1;
}